

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O1

bool __thiscall
vkt::QueryPool::anon_unknown_0::GraphicBasicTestInstance::checkImage(GraphicBasicTestInstance *this)

{
  Image *this_00;
  TestLog *log;
  bool bVar1;
  int i;
  VkQueue queue;
  Allocator *allocator;
  long lVar2;
  int x;
  int iVar3;
  int y;
  int iVar4;
  Vec4 local_b0;
  Texture2D referenceFrame;
  ConstPixelBufferAccess renderedFrame;
  
  queue = Context::getUniversalQueue
                    ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  this_00 = (this->m_colorAttachmentImage).m_ptr;
  allocator = Context::getDefaultAllocator
                        ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  iVar4 = 0;
  Draw::Image::readSurface
            (&renderedFrame,this_00,queue,allocator,VK_IMAGE_LAYOUT_GENERAL,
             (VkOffset3D)(ZEXT412(0) << 0x40),0x40,0x40,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  local_b0.m_data._0_8_ = ::vk::mapVkFormat(this->m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D(&referenceFrame,(TextureFormat *)&local_b0,0x40,0x40);
  tcu::Texture2D::allocLevel(&referenceFrame,0);
  do {
    iVar3 = 0;
    do {
      tcu::PixelBufferAccess::setPixel
                (referenceFrame.super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &((this->m_data->
                   super__Vector_base<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
                   )._M_impl.super__Vector_impl_data._M_start)->color,iVar3,iVar4,0);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0x20);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x20);
  iVar4 = 0x20;
  do {
    iVar3 = 0;
    do {
      tcu::PixelBufferAccess::setPixel
                (referenceFrame.super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &(this->m_data->
                  super__Vector_base<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
                  )._M_impl.super__Vector_impl_data._M_start[4].color,iVar3,iVar4,0);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0x20);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x40);
  iVar4 = 0;
  do {
    iVar3 = 0x20;
    do {
      tcu::PixelBufferAccess::setPixel
                (referenceFrame.super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &(this->m_data->
                  super__Vector_base<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
                  )._M_impl.super__Vector_impl_data._M_start[8].color,iVar3,iVar4,0);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0x40);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x20);
  iVar4 = 0x20;
  do {
    iVar3 = 0x20;
    do {
      tcu::PixelBufferAccess::setPixel
                (referenceFrame.super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &(this->m_data->
                  super__Vector_base<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
                  )._M_impl.super__Vector_impl_data._M_start[0xc].color,iVar3,iVar4,0);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0x40);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x40);
  log = ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  lVar2 = 0;
  do {
    local_b0.m_data[lVar2] = 0.01;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  bVar1 = tcu::floatThresholdCompare
                    (log,"Result","Image comparison result",
                     &(referenceFrame.super_TextureLevelPyramid.m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess,
                     &renderedFrame,&local_b0,COMPARE_LOG_ON_ERROR);
  tcu::Texture3D::~Texture3D((Texture3D *)&referenceFrame);
  return bVar1;
}

Assistant:

bool GraphicBasicTestInstance::checkImage (void)
{
	const VkQueue						queue			= m_context.getUniversalQueue();
	const VkOffset3D					zeroOffset		= { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess	renderedFrame	= m_colorAttachmentImage->readSurface(queue, m_context.getDefaultAllocator(),
															VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, VK_IMAGE_ASPECT_COLOR_BIT);
	int									colorNdx		= 0;
	tcu::Texture2D						referenceFrame	(mapVkFormat(m_colorAttachmentFormat), WIDTH, HEIGHT);
	referenceFrame.allocLevel(0);

	for (int y = 0; y < HEIGHT/2; ++y)
	for (int x = 0; x < WIDTH/2; ++x)
			referenceFrame.getLevel(0).setPixel(m_data[colorNdx].color, x, y);

	colorNdx += 4;
	for (int y =  HEIGHT/2; y < HEIGHT; ++y)
	for (int x = 0; x < WIDTH/2; ++x)
			referenceFrame.getLevel(0).setPixel(m_data[colorNdx].color, x, y);

	colorNdx += 4;
	for (int y = 0; y < HEIGHT/2; ++y)
	for (int x =  WIDTH/2; x < WIDTH; ++x)
			referenceFrame.getLevel(0).setPixel(m_data[colorNdx].color, x, y);

	colorNdx += 4;
	for (int y =  HEIGHT/2; y < HEIGHT; ++y)
	for (int x =  WIDTH/2; x < WIDTH; ++x)
			referenceFrame.getLevel(0).setPixel(m_data[colorNdx].color, x, y);

	return tcu::floatThresholdCompare(m_context.getTestContext().getLog(), "Result", "Image comparison result", referenceFrame.getLevel(0), renderedFrame, tcu::Vec4(0.01f), tcu::COMPARE_LOG_ON_ERROR);
}